

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O0

void __thiscall KDReports::ReportBuilder::addVerticalSpacing(ReportBuilder *this,qreal space)

{
  QTextCursor *pQVar1;
  qreal qVar2;
  QArrayDataPointer<char16_t> local_98;
  QString local_80;
  QTextCharFormat local_68 [8];
  QTextCharFormat charFormat;
  QTextBlockFormat local_48 [8];
  QTextBlockFormat blockFormat;
  QTextCursor *cursor;
  qreal space_local;
  ReportBuilder *this_local;
  char16_t *str;
  
  pQVar1 = ReportBuilder::cursor(this);
  QTextCursor::beginEditBlock();
  if ((this->m_first & 1U) == 0) {
    QTextCursor::insertBlock();
  }
  else {
    this->m_first = false;
  }
  QTextBlockFormat::QTextBlockFormat(local_48);
  qVar2 = mmToPixels(space * 0.5);
  QTextBlockFormat::setTopMargin(local_48,qVar2);
  qVar2 = mmToPixels(space * 0.5);
  QTextBlockFormat::setBottomMargin(local_48,qVar2);
  QTextCursor::setBlockFormat((QTextBlockFormat *)pQVar1);
  QTextCharFormat::QTextCharFormat(local_68);
  QTextCharFormat::setFontPointSize(local_68,1.0);
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar1);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_98,(Data *)0x0,L" ",1);
  QString::QString(&local_80,&local_98);
  QTextCursor::insertText((QString *)pQVar1);
  QString::~QString(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QTextCursor::endEditBlock();
  QTextCharFormat::~QTextCharFormat(local_68);
  QTextBlockFormat::~QTextBlockFormat(local_48);
  return;
}

Assistant:

void KDReports::ReportBuilder::addVerticalSpacing(qreal space)
{
    QTextCursor &cursor = this->cursor();
    cursor.beginEditBlock();

    if (!m_first) {
        cursor.insertBlock();
    } else {
        m_first = false;
    }

    QTextBlockFormat blockFormat;
    blockFormat.setTopMargin(KDReports::mmToPixels(space / 2));
    blockFormat.setBottomMargin(KDReports::mmToPixels(space / 2));
    cursor.setBlockFormat(blockFormat);
    QTextCharFormat charFormat;
    charFormat.setFontPointSize(1);
    cursor.setCharFormat(charFormat);
    cursor.insertText(QStringLiteral(" ")); // this ensures the point size 1 is actually used, making the paragraph much smaller
    cursor.endEditBlock();
}